

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plot-intermediate.cxx
# Opt level: O2

Parameters * parseCommandLine(Parameters *__return_storage_ptr__,int argc,char **argv)

{
  allocator<char> aStack_528;
  allocator<char> local_527;
  allocator<char> local_526;
  allocator<char> local_525;
  int local_524;
  string local_520;
  string local_500;
  string local_4e0;
  string local_4c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_480;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_460;
  ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  argSolutionName;
  ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  argEdgesFileName;
  ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  argNodesFileName;
  CmdLine tclap;
  
  Parameters::Parameters(__return_storage_ptr__);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&argNodesFileName,"track",(allocator<char> *)&argSolutionName);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&argEdgesFileName,"1.0",(allocator<char> *)&local_520);
  TCLAP::CmdLine::CmdLine(&tclap,(string *)&argNodesFileName,' ',(string *)&argEdgesFileName,true);
  std::__cxx11::string::~string((string *)&argEdgesFileName);
  std::__cxx11::string::~string((string *)&argNodesFileName);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&argEdgesFileName,"n",(allocator<char> *)&local_4e0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&argSolutionName,"nodes-file",(allocator<char> *)&local_4c0);
  local_524 = argc;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_520,"nodes information",&local_527);
  std::__cxx11::string::string
            ((string *)&local_460,(string *)&__return_storage_ptr__->nodesFileName);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_500,"nodes-file",&aStack_528);
  TCLAP::ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::ValueArg(&argNodesFileName,(string *)&argEdgesFileName,(string *)&argSolutionName,&local_520,
             true,&local_460,&local_500,&tclap.super_CmdLineInterface,(Visitor *)0x0);
  std::__cxx11::string::~string((string *)&local_500);
  std::__cxx11::string::~string((string *)&local_460);
  std::__cxx11::string::~string((string *)&local_520);
  std::__cxx11::string::~string((string *)&argSolutionName);
  std::__cxx11::string::~string((string *)&argEdgesFileName);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&argSolutionName,"e",(allocator<char> *)&local_4c0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_520,"edges-file",&local_527);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_500,"edges information",&aStack_528);
  std::__cxx11::string::string((string *)&local_480,(string *)__return_storage_ptr__);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4e0,"edges-file",&local_526);
  TCLAP::ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::ValueArg(&argEdgesFileName,(string *)&argSolutionName,&local_520,&local_500,true,&local_480,
             &local_4e0,&tclap.super_CmdLineInterface,(Visitor *)0x0);
  std::__cxx11::string::~string((string *)&local_4e0);
  std::__cxx11::string::~string((string *)&local_480);
  std::__cxx11::string::~string((string *)&local_500);
  std::__cxx11::string::~string((string *)&local_520);
  std::__cxx11::string::~string((string *)&argSolutionName);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_520,"s",&local_527);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_500,"solution-name",&aStack_528);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4e0,"solution name",&local_526);
  std::__cxx11::string::string((string *)&local_4a0,(string *)&__return_storage_ptr__->solutionName)
  ;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4c0,"solution-name",&local_525);
  TCLAP::ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::ValueArg(&argSolutionName,&local_520,&local_500,&local_4e0,true,&local_4a0,&local_4c0,
             &tclap.super_CmdLineInterface,(Visitor *)0x0);
  std::__cxx11::string::~string((string *)&local_4c0);
  std::__cxx11::string::~string((string *)&local_4a0);
  std::__cxx11::string::~string((string *)&local_4e0);
  std::__cxx11::string::~string((string *)&local_500);
  std::__cxx11::string::~string((string *)&local_520);
  TCLAP::CmdLine::parse(&tclap,local_524,argv);
  std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
  std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->nodesFileName);
  std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->solutionName);
  TCLAP::ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~ValueArg(&argSolutionName);
  TCLAP::ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~ValueArg(&argEdgesFileName);
  TCLAP::ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~ValueArg(&argNodesFileName);
  TCLAP::CmdLine::~CmdLine(&tclap);
  return __return_storage_ptr__;
}

Assistant:

Parameters parseCommandLine(int argc, char** argv)
try
{
    Parameters parameters;

    TCLAP::CmdLine tclap("track", ' ', "1.0");
    TCLAP::ValueArg<string> argNodesFileName("n", "nodes-file", "nodes information", true, parameters.nodesFileName, "nodes-file", tclap);
    TCLAP::ValueArg<string> argEdgesFileName("e", "edges-file", "edges information", true, parameters.edgesFileName, "edges-file", tclap);
    TCLAP::ValueArg<string> argSolutionName("s", "solution-name", "solution name", true, parameters.solutionName, "solution-name", tclap);
    
    tclap.parse(argc, argv);

    parameters.edgesFileName = argEdgesFileName.getValue();
    parameters.nodesFileName = argNodesFileName.getValue();
    parameters.solutionName = argSolutionName.getValue();

    return parameters;
}
catch(TCLAP::ArgException& e)
{
    throw runtime_error(e.error());
}